

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

bool __thiscall
ON_CurveArray::GetTightBoundingBox
          (ON_CurveArray *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  ON_Curve *pOVar1;
  ON_Curve **ppOVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ON_3dPointArray P;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  if (((this->super_ON_SimpleArray<ON_Curve_*>).m_count == 1) &&
     (pOVar1 = *(this->super_ON_SimpleArray<ON_Curve_*>).m_a, pOVar1 != (ON_Curve *)0x0)) {
    iVar5 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1a])
                      (pOVar1,tight_bbox,(ulong)bGrowBox,xform);
    return SUB41(iVar5,0);
  }
  if (bGrowBox) {
    bVar4 = ON_BoundingBox::IsValid(tight_bbox);
    bGrowBox = bVar4 && bGrowBox;
  }
  if (bGrowBox == false) {
    ON_BoundingBox::Destroy(tight_bbox);
  }
  iVar5 = (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
  if (0 < iVar5) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,iVar5 * 2);
    if (0 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count) {
      lVar7 = 0;
      do {
        ppOVar2 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a;
        if (ppOVar2[lVar7] != (ON_Curve *)0x0) {
          ON_Curve::PointAtStart(&local_48,ppOVar2[lVar7]);
          ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
          ON_Curve::PointAtEnd(&local_48,(this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar7]);
          ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count);
    }
    bVar4 = ON_3dPointArray::GetTightBoundingBox
                      ((ON_3dPointArray *)&local_60,tight_bbox,bGrowBox,xform);
    bGrowBox = (bool)(bGrowBox | bVar4);
    uVar6 = (uint)bGrowBox;
    if (0 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count) {
      lVar7 = 0;
      do {
        pOVar1 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar7];
        uVar3 = uVar6;
        if (pOVar1 != (ON_Curve *)0x0) {
          iVar5 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1a])
                            (pOVar1,tight_bbox,(ulong)(uVar6 & 1),xform);
          uVar3 = 1;
          if ((char)iVar5 == '\0') {
            uVar3 = uVar6;
          }
        }
        uVar6 = uVar3;
        bGrowBox = SUB41(uVar6,0);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count);
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
  }
  return (bool)(bGrowBox & 1);
}

Assistant:

bool ON_CurveArray::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  if ( 1 == m_count && m_a[0] )
  {
    return m_a[0]->GetTightBoundingBox(tight_bbox,bGrowBox,xform);
  }

  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }

  if ( m_count > 0 )
  {
    int i;
    // getting box of endpoints tends to help us avoid testing curves
    ON_3dPointArray P(2*m_count);
    for ( i = 0; i < m_count; i++ )
    {
      if ( m_a[i] )
      {
        P.Append( m_a[i]->PointAtStart() );
        P.Append( m_a[i]->PointAtEnd() );
      }
    }
    if ( P.GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
    {
      bGrowBox = true;
    }

    for ( i = 0; i < m_count; i++ )
    {
      if ( m_a[i] )
      {
        if ( m_a[i]->GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
        {
          bGrowBox = true;
        }
      }
    }
  }

  return (0!=bGrowBox);  
}